

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControlPrivate::cursorMoveKeyEvent(QWidgetTextControlPrivate *this,QKeyEvent *e)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QWidgetTextControlPrivate *this_00;
  ulong uVar8;
  QWidgetTextControlPrivate *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  QTextLine QVar10;
  bool isNavigationEvent;
  bool ignoreNavigationEvents;
  bool moved;
  bool visualNavigation;
  MoveOperation op;
  MoveMode mode;
  int oldCursorPos;
  QWidgetTextControl *q;
  QTextLine line_1;
  QTextLine line;
  QTextCursor oldSelection;
  QTextBlock block_1;
  QTextBlock block;
  StandardKey in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  MoveMode local_9c;
  int iVar11;
  bool local_71;
  undefined1 *local_70;
  QTextEngine *local_68;
  undefined1 *local_60;
  QTextEngine *local_58;
  undefined1 *local_50 [3];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetTextControlPrivate *)q_func(in_RDI);
  uVar8 = QTextCursor::isNull();
  if ((uVar8 & 1) != 0) {
    local_71 = false;
    goto LAB_0070f65d;
  }
  local_50[0] = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)local_50,&in_RDI->cursor);
  iVar4 = QTextCursor::position();
  iVar11 = 0;
  bVar1 = ::operator==((QKeyEvent *)
                       CONCAT17(in_stack_ffffffffffffff47,
                                CONCAT16(in_stack_ffffffffffffff46,
                                         CONCAT24(in_stack_ffffffffffffff44,
                                                  in_stack_ffffffffffffff40))),
                       in_stack_ffffffffffffff3c);
  if (bVar1) {
    local_9c = 0x13;
LAB_0070f49b:
    QTextCursor::visualNavigation();
    QTextCursor::setVisualNavigation((bool)((char)in_RDI + -0x78));
    bVar2 = QTextCursor::movePosition((int)in_RDI + 0x88,local_9c,iVar11);
    bVar2 = bVar2 & 1;
    QTextCursor::setVisualNavigation((bool)((char)in_RDI + -0x78));
    (**(code **)(*(long *)this_00 + 0x60))();
    bVar3 = in_RDI->ignoreUnusedNavigationEvents & 1;
    iVar6 = QKeyEvent::key((QKeyEvent *)in_RSI);
    bVar1 = true;
    if (iVar6 != 0x1000013) {
      iVar6 = QKeyEvent::key((QKeyEvent *)in_RSI);
      bVar1 = iVar6 == 0x1000015;
    }
    bVar9 = true;
    if (!bVar1) {
      iVar6 = QKeyEvent::key((QKeyEvent *)in_RSI);
      bVar9 = true;
      if (iVar6 != 0x1000012) {
        iVar6 = QKeyEvent::key((QKeyEvent *)in_RSI);
        bVar9 = iVar6 == 0x1000014;
      }
    }
    if ((bVar2 & 1) == 0) {
      if (((bVar3 & 1) != 0) && (bVar9)) {
        iVar6 = QTextCursor::anchor();
        iVar7 = QTextCursor::anchor();
        if (iVar6 == iVar7) {
          local_71 = false;
          goto LAB_0070f653;
        }
      }
    }
    else {
      iVar6 = QTextCursor::position();
      if (iVar6 != iVar4) {
        QWidgetTextControl::cursorPositionChanged((QWidgetTextControl *)0x70f5cb);
      }
      QWidgetTextControl::microFocusChanged((QWidgetTextControl *)0x70f5d5);
    }
    selectionChanged(in_RSI,SUB81((ulong)this_00 >> 0x38,0));
    repaintOldAndNewSelection(this_00,(QTextCursor *)CONCAT44(iVar4,iVar11));
    local_71 = true;
  }
  else {
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 9;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0x13;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 9;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0x14;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 10;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 3;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xd;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 4;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xf;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = KeepAnchor;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xb;
      iVar11 = 1;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 2;
      iVar11 = 1;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::block();
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
      QVar10 = currentTextLine((QTextCursor *)
                               CONCAT17(in_stack_ffffffffffffff5f,
                                        CONCAT16(in_stack_ffffffffffffff5e,
                                                 CONCAT15(in_stack_ffffffffffffff5d,
                                                          CONCAT14(in_stack_ffffffffffffff5c,
                                                                   in_stack_ffffffffffffff58)))));
      local_58 = QVar10.eng;
      local_60 = (undefined1 *)CONCAT44(local_60._4_4_,QVar10.index);
      QTextBlock::previous();
      uVar5 = QTextBlock::isValid();
      bVar1 = false;
      if ((uVar5 & 1) == 0) {
        bVar9 = QTextLine::isValid((QTextLine *)&local_60);
        bVar1 = false;
        if (bVar9) {
          iVar6 = QTextLine::lineNumber((QTextLine *)&local_60);
          bVar1 = iVar6 == 0;
        }
      }
      if (bVar1) {
        local_9c = KeepAnchor;
      }
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xc;
      iVar11 = 1;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::block();
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
      QVar10 = currentTextLine((QTextCursor *)
                               CONCAT17(in_stack_ffffffffffffff5f,
                                        CONCAT16(in_stack_ffffffffffffff5e,
                                                 CONCAT15(in_stack_ffffffffffffff5d,
                                                          CONCAT14(in_stack_ffffffffffffff5c,
                                                                   in_stack_ffffffffffffff58)))));
      local_68 = QVar10.eng;
      local_70 = (undefined1 *)CONCAT44(local_70._4_4_,QVar10.index);
      QTextBlock::next();
      uVar5 = QTextBlock::isValid();
      bVar1 = false;
      if ((uVar5 & 1) == 0) {
        bVar9 = QTextLine::isValid((QTextLine *)&local_70);
        bVar1 = false;
        if (bVar9) {
          iVar6 = QTextLine::lineNumber((QTextLine *)&local_70);
          QTextBlock::layout();
          iVar7 = QTextLayout::lineCount();
          bVar1 = iVar6 == iVar7 + -1;
        }
      }
      if (bVar1) {
        local_9c = 0xb;
      }
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0x14;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 10;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xf;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 4;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xc;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 2;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 3;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xd;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = KeepAnchor;
      goto LAB_0070f49b;
    }
    bVar1 = ::operator==((QKeyEvent *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),
                         in_stack_ffffffffffffff3c);
    if (bVar1) {
      local_9c = 0xb;
      goto LAB_0070f49b;
    }
    local_71 = false;
  }
LAB_0070f653:
  QTextCursor::~QTextCursor((QTextCursor *)local_50);
LAB_0070f65d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_71;
}

Assistant:

bool QWidgetTextControlPrivate::cursorMoveKeyEvent(QKeyEvent *e)
{
#ifdef QT_NO_SHORTCUT
    Q_UNUSED(e);
#endif

    Q_Q(QWidgetTextControl);
    if (cursor.isNull())
        return false;

    const QTextCursor oldSelection = cursor;
    const int oldCursorPos = cursor.position();

    QTextCursor::MoveMode mode = QTextCursor::MoveAnchor;
    QTextCursor::MoveOperation op = QTextCursor::NoMove;

    if (false) {
    }
#ifndef QT_NO_SHORTCUT
    if (e == QKeySequence::MoveToNextChar) {
            op = QTextCursor::Right;
    }
    else if (e == QKeySequence::MoveToPreviousChar) {
            op = QTextCursor::Left;
    }
    else if (e == QKeySequence::SelectNextChar) {
           op = QTextCursor::Right;
           mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousChar) {
            op = QTextCursor::Left;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectNextWord) {
            op = QTextCursor::WordRight;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousWord) {
            op = QTextCursor::WordLeft;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfLine) {
            op = QTextCursor::StartOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfLine) {
            op = QTextCursor::EndOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfBlock) {
            op = QTextCursor::StartOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfBlock) {
            op = QTextCursor::EndOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfDocument) {
            op = QTextCursor::Start;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfDocument) {
            op = QTextCursor::End;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousLine) {
            op = QTextCursor::Up;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.previous().isValid()
                    && line.isValid()
                    && line.lineNumber() == 0)
                    op = QTextCursor::Start;
            }
    }
    else if (e == QKeySequence::SelectNextLine) {
            op = QTextCursor::Down;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.next().isValid()
                    && line.isValid()
                    && line.lineNumber() == block.layout()->lineCount() - 1)
                    op = QTextCursor::End;
            }
    }
    else if (e == QKeySequence::MoveToNextWord) {
            op = QTextCursor::WordRight;
    }
    else if (e == QKeySequence::MoveToPreviousWord) {
            op = QTextCursor::WordLeft;
    }
    else if (e == QKeySequence::MoveToEndOfBlock) {
            op = QTextCursor::EndOfBlock;
    }
    else if (e == QKeySequence::MoveToStartOfBlock) {
            op = QTextCursor::StartOfBlock;
    }
    else if (e == QKeySequence::MoveToNextLine) {
            op = QTextCursor::Down;
    }
    else if (e == QKeySequence::MoveToPreviousLine) {
            op = QTextCursor::Up;
    }
    else if (e == QKeySequence::MoveToStartOfLine) {
            op = QTextCursor::StartOfLine;
    }
    else if (e == QKeySequence::MoveToEndOfLine) {
            op = QTextCursor::EndOfLine;
    }
    else if (e == QKeySequence::MoveToStartOfDocument) {
            op = QTextCursor::Start;
    }
    else if (e == QKeySequence::MoveToEndOfDocument) {
            op = QTextCursor::End;
    }
#endif // QT_NO_SHORTCUT
    else {
        return false;
    }

// Except for pageup and pagedown, OS X has very different behavior, we don't do it all, but
// here's the breakdown:
// Shift still works as an anchor, but only one of the other keys can be down Ctrl (Command),
// Alt (Option), or Meta (Control).
// Command/Control + Left/Right -- Move to left or right of the line
//                 + Up/Down -- Move to top bottom of the file. (Control doesn't move the cursor)
// Option + Left/Right -- Move one word Left/right.
//        + Up/Down  -- Begin/End of Paragraph.
// Home/End Top/Bottom of file. (usually don't move the cursor, but will select)

    bool visualNavigation = cursor.visualNavigation();
    cursor.setVisualNavigation(true);
    const bool moved = cursor.movePosition(op, mode);
    cursor.setVisualNavigation(visualNavigation);
    q->ensureCursorVisible();

    bool ignoreNavigationEvents = ignoreUnusedNavigationEvents;
    bool isNavigationEvent = e->key() == Qt::Key_Up || e->key() == Qt::Key_Down;

#ifdef QT_KEYPAD_NAVIGATION
    ignoreNavigationEvents = ignoreNavigationEvents || QApplicationPrivate::keypadNavigationEnabled();
    isNavigationEvent = isNavigationEvent ||
                        (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional
                         && (e->key() == Qt::Key_Left || e->key() == Qt::Key_Right));
#else
    isNavigationEvent = isNavigationEvent || e->key() == Qt::Key_Left || e->key() == Qt::Key_Right;
#endif

    if (moved) {
        if (cursor.position() != oldCursorPos)
            emit q->cursorPositionChanged();
        emit q->microFocusChanged();
    } else if (ignoreNavigationEvents && isNavigationEvent && oldSelection.anchor() == cursor.anchor()) {
        return false;
    }

    selectionChanged(/*forceEmitSelectionChanged =*/(mode == QTextCursor::KeepAnchor));

    repaintOldAndNewSelection(oldSelection);

    return true;
}